

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Guild.cpp
# Opt level: O1

void Handlers::Guild_Create(Character *character,PacketReader *reader)

{
  World *pWVar1;
  GuildManager *pGVar2;
  _Hash_node_base *p_Var3;
  _Hash_node_base *p_Var4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  size_type sVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  uint num;
  mapped_type *pmVar9;
  bool bVar10;
  shared_ptr<Guild_Create> create;
  shared_ptr<Guild> guild;
  PacketBuilder reply;
  string description;
  string tag;
  string rank_str;
  string name;
  _Hash_node_base *local_1d0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1c8;
  undefined1 local_1c0 [16];
  undefined1 local_1b0 [48];
  undefined1 local_180 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_160;
  string local_150;
  string local_130;
  long *local_110 [2];
  long local_100 [2];
  key_type local_f0;
  long *local_d0 [2];
  long local_c0 [2];
  key_type local_b0;
  string local_90;
  key_type local_70;
  string local_50;
  
  PacketReader::GetInt(reader);
  PacketReader::GetByte(reader);
  PacketReader::GetBreakString_abi_cxx11_(&local_150,reader,0xff);
  PacketReader::GetBreakString_abi_cxx11_(&local_50,reader,0xff);
  PacketReader::GetBreakString_abi_cxx11_((string *)(local_180 + 0x10),reader,0xff);
  sVar5 = local_150._M_string_length;
  bVar6 = true;
  if (local_150._M_string_length < (World *)0x4) {
    pWVar1 = character->world;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"GuildMaxNameLength","");
    pmVar9 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&pWVar1->config,&local_70);
    iVar7 = util::variant::GetInt(pmVar9);
    if (local_50._M_string_length <= (ulong)(long)iVar7) {
      pGVar2 = character->world->guildmanager;
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_90,local_180._16_8_,local_180._24_8_ + local_180._16_8_);
      bVar6 = GuildManager::ValidDescription(pGVar2,&local_90);
      bVar6 = !bVar6;
      bVar10 = true;
      goto LAB_001a79b5;
    }
  }
  bVar10 = false;
LAB_001a79b5:
  if ((bVar10) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2)) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((sVar5 < (World *)0x4) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2)) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((!bVar6) && (character->npc_type == Guild)) {
    if ((character->guild).super___shared_ptr<Guild,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      iVar7 = Character::HasItem(character,1,false);
      pWVar1 = character->world;
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"GuildPrice","");
      pmVar9 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&pWVar1->config,&local_b0);
      iVar8 = util::variant::GetInt(pmVar9);
      bVar6 = iVar8 <= iVar7;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      bVar6 = false;
    }
    if (bVar6) {
      pGVar2 = character->world->guildmanager;
      local_d0[0] = local_c0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_d0,local_150._M_dataplus._M_p,
                 local_150._M_dataplus._M_p + (long)(int *)local_150._M_string_length);
      GuildManager::GetCreate((GuildManager *)&local_1d0,(string *)pGVar2);
      if (local_d0[0] != local_c0) {
        operator_delete(local_d0[0],local_c0[0] + 1);
      }
      if ((local_1d0 == (_Hash_node_base *)0x0) || ((Character *)local_1d0[4]._M_nxt != character))
      {
        bVar6 = false;
        bVar10 = false;
      }
      else {
        p_Var3 = local_1d0[0xe]._M_nxt;
        p_Var4 = local_1d0[0xd]._M_nxt;
        pWVar1 = character->world;
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"GuildCreateMembers","")
        ;
        pmVar9 = std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)&pWVar1->config,&local_f0);
        iVar7 = util::variant::GetInt(pmVar9);
        bVar10 = (ulong)(long)iVar7 <= (ulong)((long)p_Var3 - (long)p_Var4 >> 4);
        bVar6 = true;
      }
      if ((bVar6) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2)) {
        operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
      }
      if (bVar10) {
        pGVar2 = character->world->guildmanager;
        local_180._0_8_ = local_1d0;
        local_180._8_8_ = local_1c8;
        if (local_1c8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            local_1c8->_M_use_count = local_1c8->_M_use_count + 1;
            UNLOCK();
          }
          else {
            local_1c8->_M_use_count = local_1c8->_M_use_count + 1;
          }
        }
        local_110[0] = local_100;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_110,local_180._16_8_,local_180._24_8_ + local_180._16_8_);
        GuildManager::CreateGuild
                  ((GuildManager *)local_1c0,(shared_ptr<Guild_Create> *)pGVar2,(string *)local_180)
        ;
        if (local_110[0] != local_100) {
          operator_delete(local_110[0],local_100[0] + 1);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_180._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_180._8_8_);
        }
        pWVar1 = character->world;
        local_1b0._0_8_ = local_1b0 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"GuildPrice","");
        pmVar9 = std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)&pWVar1->config,(key_type *)local_1b0);
        iVar7 = util::variant::GetInt(pmVar9);
        Character::DelItem(character,1,iVar7);
        if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
          operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
        }
        Character::GuildRankString_abi_cxx11_(&local_130,character);
        PacketBuilder::PacketBuilder
                  ((PacketBuilder *)local_1b0,PACKET_GUILD,PACKET_CREATE,
                   local_130._M_string_length + *(long *)(local_1c0._0_8_ + 0x40) + 0xd);
        iVar7 = Character::PlayerID((Character *)local_1d0[4]._M_nxt);
        PacketBuilder::AddShort((PacketBuilder *)local_1b0,(unsigned_short)iVar7);
        PacketBuilder::AddByte((PacketBuilder *)local_1b0,0xff);
        PacketBuilder::AddBreakString
                  ((PacketBuilder *)local_1b0,(string *)(local_1c0._0_8_ + 0x18),0xff);
        PacketBuilder::AddBreakString
                  ((PacketBuilder *)local_1b0,(string *)(local_1c0._0_8_ + 0x38),0xff);
        PacketBuilder::AddBreakString((PacketBuilder *)local_1b0,&local_130,0xff);
        num = Character::HasItem(character,1,false);
        PacketBuilder::AddInt((PacketBuilder *)local_1b0,num);
        Character::Send(character,(PacketBuilder *)local_1b0);
        this = (character->guild_create).
               super___shared_ptr<Guild_Create,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
        (character->guild_create).super___shared_ptr<Guild_Create,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)0x0;
        (character->guild_create).super___shared_ptr<Guild_Create,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
        }
        PacketBuilder::~PacketBuilder((PacketBuilder *)local_1b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p != &local_130.field_2) {
          operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c0._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c0._8_8_);
        }
      }
      if (local_1c8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1c8);
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._16_8_ != &local_160) {
    operator_delete((void *)local_180._16_8_,(ulong)(local_160._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Guild_Create(Character *character, PacketReader &reader)
{
	/*int session = */reader.GetInt();
	reader.GetByte();
	std::string tag = reader.GetBreakString();
	std::string name = reader.GetBreakString();
	std::string description = reader.GetBreakString();

	if (tag.length() > 3
	 || name.length() > std::size_t(int(character->world->config["GuildMaxNameLength"]))
	 || !character->world->guildmanager->ValidDescription(description))
	{
		return;
	}

	if (character->npc_type == ENF::Guild)
	{
		if (!character->guild
		 && character->HasItem(1) >= static_cast<int>(character->world->config["GuildPrice"]))
		{
			std::shared_ptr<class Guild_Create> create = character->world->guildmanager->GetCreate(tag);

			if (create && create->leader == character
			 && create->members.size() >= static_cast<std::size_t>(static_cast<int>(character->world->config["GuildCreateMembers"])))
			{
				std::shared_ptr<Guild> guild = character->world->guildmanager->CreateGuild(create, description);

				character->DelItem(1, character->world->config["GuildPrice"]);

				std::string rank_str = character->GuildRankString();

				PacketBuilder reply(PACKET_GUILD, PACKET_CREATE, 13 + guild->name.length() + rank_str.length());
				reply.AddShort(create->leader->PlayerID());
				reply.AddByte(255);
				reply.AddBreakString(guild->tag);
				reply.AddBreakString(guild->name);
				reply.AddBreakString(rank_str);
				reply.AddInt(character->HasItem(1));
				character->Send(reply);

				character->guild_create.reset();
			}
		}
	}
}